

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::BatchedMatMulLayerParams
          (BatchedMatMulLayerParams *this,BatchedMatMulLayerParams *from)

{
  void *pvVar1;
  WeightParams *pWVar2;
  uint64 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  WeightParams *pWVar7;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BatchedMatMulLayerParams_00397b80;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar2 = from->weights_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (BatchedMatMulLayerParams *)&_BatchedMatMulLayerParams_default_instance_) {
    pWVar7 = (WeightParams *)0x0;
  }
  else {
    pWVar7 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar7,pWVar2);
  }
  this->weights_ = pWVar7;
  pWVar2 = from->bias_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (BatchedMatMulLayerParams *)&_BatchedMatMulLayerParams_default_instance_) {
    pWVar7 = (WeightParams *)0x0;
  }
  else {
    pWVar7 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar7,pWVar2);
  }
  this->bias_ = pWVar7;
  uVar3 = from->weightmatrixseconddimension_;
  this->weightmatrixfirstdimension_ = from->weightmatrixfirstdimension_;
  this->weightmatrixseconddimension_ = uVar3;
  bVar4 = from->transposeb_;
  bVar5 = from->hasbias_;
  bVar6 = from->int8dynamicquantize_;
  this->transposea_ = from->transposea_;
  this->transposeb_ = bVar4;
  this->hasbias_ = bVar5;
  this->int8dynamicquantize_ = bVar6;
  return;
}

Assistant:

BatchedMatMulLayerParams::BatchedMatMulLayerParams(const BatchedMatMulLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  ::memcpy(&weightmatrixfirstdimension_, &from.weightmatrixfirstdimension_,
    reinterpret_cast<char*>(&int8dynamicquantize_) -
    reinterpret_cast<char*>(&weightmatrixfirstdimension_) + sizeof(int8dynamicquantize_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BatchedMatMulLayerParams)
}